

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_utils.cpp
# Opt level: O1

void libtorrent::aux::initialize_storage
               (file_storage *fs,string *save_path,stat_cache *sc,
               vector<download_priority_t,_file_index_t> *file_priority,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_libtorrent::storage_error_&)>
               *create_file,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::storage_error_&)>
               *create_link,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_long)>
               *oversized_file,storage_error *ec)

{
  pointer psVar1;
  undefined1 uVar2;
  _Alloc_hider _Var3;
  size_type this;
  bool bVar4;
  file_flags_t fVar5;
  int iVar6;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar7;
  pointer pcVar8;
  int64_t iVar9;
  file_index_t index;
  ulong uVar10;
  pointer pbVar11;
  string_view base;
  string_view target_00;
  string target;
  error_code local_128;
  string local_118;
  string local_f8;
  string *local_d8;
  pointer *local_d0;
  char *local_c8;
  pointer local_c0 [2];
  string local_b0;
  string local_90;
  _Any_data *local_70;
  _Any_data *local_68;
  pointer local_60;
  stat_cache *local_58;
  string local_50;
  
  local_d8 = save_path;
  local_70 = (_Any_data *)create_file;
  local_68 = (_Any_data *)create_link;
  local_58 = sc;
  iVar7 = file_storage::file_range(fs);
  pbVar11 = (pointer)((ulong)iVar7 >> 0x20);
  if (iVar7._begin.m_val.m_val != iVar7._end.m_val.m_val) {
    uVar10 = (ulong)iVar7._begin.m_val.m_val;
    local_60 = pbVar11;
    do {
      psVar1 = (file_priority->
               super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ).
               super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)uVar10 <
           (long)(*(int *)&(file_priority->
                           super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                           ).
                           super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1)) &&
         (psVar1[uVar10].m_val == '\0')) {
        iVar6 = 3;
      }
      else {
        index.m_val = (int)uVar10;
        bVar4 = file_storage::pad_file_at(fs,index);
        iVar6 = 3;
        if (!bVar4) {
          local_128.val_ = 0;
          local_128._4_4_ = local_128._4_4_ & 0xffffff00;
          local_128.cat_ =
               &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
          pcVar8 = (pointer)stat_cache::get_filesize(local_58,index,fs,local_d8,&local_128);
          uVar2 = (undefined1)(uVar10 >> 0x10);
          if (local_128.failed_ == true) {
            local_118._M_dataplus._M_p = (pointer)0x100000002;
            local_118._M_string_length =
                 (size_type)&boost::system::detail::cat_holder<void>::generic_category_instance;
            iVar6 = (*(local_128.cat_)->_vptr_error_category[2])
                              (local_128.cat_,(ulong)(uint)local_128.val_,&local_118);
            if (((char)iVar6 == '\0') &&
               (iVar6 = (*((error_category *)local_118._M_string_length)->_vptr_error_category[3])
                                  (local_118._M_string_length,&local_128,
                                   (ulong)local_118._M_dataplus._M_p & 0xffffffff),
               (char)iVar6 == '\0')) {
              *(short *)&ec->field_0x10 = (short)uVar10;
              ec->field_0x12 = uVar2;
              ec->operation = file_stat;
              (ec->ec).val_ = local_128.val_;
              (ec->ec).failed_ = (bool)local_128.failed_;
              *(int3 *)&(ec->ec).field_0x5 = local_128._5_3_;
              (ec->ec).cat_ = local_128.cat_;
              iVar6 = 2;
              pbVar11 = local_60;
              goto LAB_00312533;
            }
          }
          iVar9 = file_storage::file_size(fs,index);
          if ((iVar9 < (long)pcVar8) && (local_128.failed_ == false)) {
            local_118._M_dataplus._M_p = pcVar8;
            local_f8._M_dataplus._M_p._0_4_ = index.m_val;
            if ((oversized_file->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_00312803;
            (*oversized_file->_M_invoker)
                      ((_Any_data *)oversized_file,
                       (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)&local_f8,
                       (long *)&local_118);
          }
          if (iVar9 == 0) {
            fVar5 = file_storage::file_flags(fs,index);
            if ((fVar5.m_val & 8) == 0) {
              local_118._M_dataplus._M_p = (pointer)0x100000002;
              local_118._M_string_length =
                   (size_type)&boost::system::detail::cat_holder<void>::generic_category_instance;
              iVar6 = (*(local_128.cat_)->_vptr_error_category[2])
                                (local_128.cat_,(ulong)(uint)local_128.val_,&local_118);
              if (((char)iVar6 != '\0') ||
                 (iVar6 = (*((error_category *)local_118._M_string_length)->_vptr_error_category[3])
                                    (local_118._M_string_length,&local_128,
                                     (ulong)local_118._M_dataplus._M_p & 0xffffffff),
                 (char)iVar6 != '\0')) {
                (ec->ec).val_ = 0;
                (ec->ec).failed_ = false;
                (ec->ec).cat_ =
                     &boost::system::detail::cat_holder<void>::system_category_instance.
                      super_error_category;
                local_118._M_dataplus._M_p._0_4_ = index.m_val;
                if (*(long *)(local_70 + 1) == 0) {
LAB_00312803:
                  ::std::__throw_bad_function_call();
                }
                (**(code **)((long)local_70 + 0x18))
                          (local_70,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                                    &local_118,ec);
                iVar6 = 1;
                pbVar11 = local_60;
                if ((ec->ec).val_ != 0) goto LAB_00312533;
              }
            }
            else {
              file_storage::file_path(&local_118,fs,index,local_d8);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
              file_storage::file_path(&local_50,fs,index,&local_b0);
              parent_path(&local_90,&local_50);
              this = local_90._M_string_length;
              _Var3._M_p = local_90._M_dataplus._M_p;
              file_storage::symlink_abi_cxx11_
                        ((file_storage *)&local_d0,(char *)fs,(char *)(uVar10 & 0xffffffff));
              base._M_str = local_c8;
              base._M_len = (size_t)_Var3._M_p;
              target_00._M_str = (char *)create_link;
              target_00._M_len = (size_t)local_d0;
              lexically_relative_abi_cxx11_(&local_f8,(libtorrent *)this,base,target_00);
              if (local_d0 != local_c0) {
                operator_delete(local_d0,(ulong)&local_c0[0]->field_0x1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if (*(long *)(local_68 + 1) == 0) {
                ::std::__throw_bad_function_call();
              }
              (**(code **)((long)local_68 + 0x18))(local_68,&local_f8,&local_118,ec);
              if ((ec->ec).failed_ == true) {
                *(short *)&ec->field_0x10 = (short)uVar10;
                ec->field_0x12 = uVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_f8._M_dataplus._M_p._4_4_,local_f8._M_dataplus._M_p._0_4_) !=
                    &local_f8.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_f8._M_dataplus._M_p._4_4_,
                                           local_f8._M_dataplus._M_p._0_4_),
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                iVar6 = 1;
                pbVar11 = local_60;
                goto LAB_00312533;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_f8._M_dataplus._M_p._4_4_,local_f8._M_dataplus._M_p._0_4_) !=
                  &local_f8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_f8._M_dataplus._M_p._4_4_,
                                         local_f8._M_dataplus._M_p._0_4_),
                                local_f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
          }
          (ec->ec).val_ = 0;
          (ec->ec).failed_ = false;
          (ec->ec).cat_ =
               &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
          iVar6 = 0;
          pbVar11 = local_60;
        }
      }
LAB_00312533:
    } while (((iVar6 == 3) || (iVar6 == 0)) && (uVar10 = uVar10 + 1, (int)pbVar11 != (int)uVar10));
  }
  return;
}

Assistant:

void initialize_storage(file_storage const& fs
		, std::string const& save_path
		, stat_cache& sc
		, aux::vector<download_priority_t, file_index_t> const& file_priority
		, std::function<void(file_index_t, storage_error&)> create_file
		, std::function<void(std::string const&, std::string const&, storage_error&)> create_link
		, std::function<void(file_index_t, std::int64_t)> oversized_file
		, storage_error& ec)
	{
		// create zero-sized files
		for (auto const file_index : fs.file_range())
		{
			// ignore files that have priority 0
			if (file_priority.end_index() > file_index
				&& file_priority[file_index] == dont_download)
			{
				continue;
			}

			// ignore pad files
			if (fs.pad_file_at(file_index)) continue;

			// this is just to see if the file exists
			error_code err;
			auto const sz = sc.get_filesize(file_index, fs, save_path, err);

			if (err && err != boost::system::errc::no_such_file_or_directory)
			{
				ec.file(file_index);
				ec.operation = operation_t::file_stat;
				ec.ec = err;
				break;
			}

			auto const fs_file_size = fs.file_size(file_index);
			if (!err && sz > fs_file_size)
			{
				// this file is oversized, alert the client
				oversized_file(file_index, sz);
			}

			// if the file is empty and doesn't already exist, create it
			// deliberately don't truncate files that already exist
			// if a file is supposed to have size 0, but already exists, we will
			// never truncate it to 0.
			if (fs_file_size == 0)
			{
				// create symlinks
				if (fs.file_flags(file_index) & file_storage::flag_symlink)
				{
#if TORRENT_HAS_SYMLINK
					std::string const path = fs.file_path(file_index, save_path);
					// we make the symlink target relative to the link itself
					std::string const target = lexically_relative(
						parent_path(fs.file_path(file_index)), fs.symlink(file_index));
					create_link(target, path, ec);
					if (ec.ec)
					{
						ec.file(file_index);
						return;
					}
#else
					TORRENT_UNUSED(create_link);
#endif
				}
				else if (err == boost::system::errc::no_such_file_or_directory)
				{
					// just creating the file is enough to make it zero-sized. If
					// there's a race here and some other process truncates the file,
					// it's not a problem, we won't access empty files ever again
					ec.ec.clear();
					create_file(file_index, ec);
					if (ec) return;
				}
			}
			ec.ec.clear();
		}
	}